

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSessionTests::TestCallback::fromAdmin(TestCallback *this,Message *message,SessionID *param_2)

{
  MsgType msgType;
  FieldBase local_78;
  
  FIX::StringField::StringField((StringField *)&local_78,0x23);
  local_78._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003262a0;
  FIX::FieldMap::getField((FieldMap *)(message + 0x70),&local_78);
  switch(*local_78.m_string._M_dataplus._M_p) {
  case '0':
    this->fromHeartbeat = this->fromHeartbeat + 1;
    break;
  case '1':
    this->fromTestRequest = this->fromTestRequest + 1;
    break;
  case '3':
    this->fromReject = this->fromReject + 1;
    break;
  case '4':
    this->fromSequenceReset = this->fromSequenceReset + 1;
    break;
  case '5':
    this->fromLogout = this->fromLogout + 1;
  }
  FIX::FieldBase::~FieldBase(&local_78);
  return;
}

Assistant:

EXCEPT( FieldNotFound, IncorrectDataFormat, IncorrectTagValue, RejectLogon )
  {
    MsgType msgType;
    message.getHeader().getField( msgType );
    switch ( msgType.getValue() [ 0 ] )
    {
      case '0':
      fromHeartbeat++; break;
      case '1':
      fromTestRequest++; break;
      case '5':
      fromLogout++; break;
      case '3':
      fromReject++; break;
      case '4':
      fromSequenceReset++; break;
    }
  }